

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_PluginTest_Sequence_TestShell::createTest(TEST_PluginTest_Sequence_TestShell *this)

{
  TEST_PluginTest_Sequence_Test *this_00;
  
  this_00 = (TEST_PluginTest_Sequence_Test *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0x8d);
  TEST_PluginTest_Sequence_Test::TEST_PluginTest_Sequence_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(PluginTest, Sequence)
{
    registry->installPlugin(thirdPlugin);
    genFixture->runAllTests();
    CHECK_EQUAL(1, thirdPlugin->preActionSequence);
    CHECK_EQUAL(2, firstPlugin->preActionSequence);
    CHECK_EQUAL(3, firstPlugin->postActionSequence);
    CHECK_EQUAL(4, thirdPlugin->postActionSequence);
    LONGS_EQUAL(2, registry->countPlugins());
}